

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_genkey.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar3;
  mbedtls_mpi E;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_mpi local_790;
  mbedtls_mpi local_778;
  mbedtls_mpi local_760;
  mbedtls_mpi local_748;
  mbedtls_mpi local_730;
  mbedtls_mpi local_718;
  mbedtls_mpi local_700;
  mbedtls_mpi local_6e8;
  mbedtls_rsa_context local_6d0;
  mbedtls_ctr_drbg_context local_580;
  mbedtls_entropy_context local_428;
  
  mbedtls_ctr_drbg_init(&local_580);
  mbedtls_rsa_init(&local_6d0,0,0);
  mbedtls_mpi_init(&local_778);
  mbedtls_mpi_init(&local_6e8);
  mbedtls_mpi_init(&local_700);
  mbedtls_mpi_init(&local_718);
  mbedtls_mpi_init(&local_790);
  mbedtls_mpi_init(&local_730);
  mbedtls_mpi_init(&local_748);
  mbedtls_mpi_init(&local_760);
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&local_428);
  uVar1 = mbedtls_ctr_drbg_seed(&local_580,mbedtls_entropy_func,&local_428,(uchar *)"rsa_genkey",10)
  ;
  if (uVar1 == 0) {
    printf(" ok\n  . Generating the RSA key [ %d-bit ]...",0x800);
    fflush(_stdout);
    uVar1 = mbedtls_rsa_gen_key(&local_6d0,mbedtls_ctr_drbg_random,&local_580,0x800,0x10001);
    if (uVar1 != 0) {
      pcVar3 = " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n";
      goto LAB_0010741d;
    }
    printf(" ok\n  . Exporting the public  key in rsa_pub.txt....");
    fflush(_stdout);
    iVar2 = mbedtls_rsa_export(&local_6d0,&local_778,&local_6e8,&local_700,&local_718,&local_790);
    if ((iVar2 == 0) &&
       (iVar2 = mbedtls_rsa_export_crt(&local_6d0,&local_730,&local_748,&local_760), iVar2 == 0)) {
      __stream = fopen("rsa_pub.txt","wb+");
      if (__stream == (FILE *)0x0) {
        pcVar3 = " failed\n  ! could not open rsa_pub.txt for writing\n";
        goto LAB_0010754a;
      }
      uVar1 = mbedtls_mpi_write_file("N = ",&local_778,0x10,(FILE *)__stream);
      if ((uVar1 != 0) ||
         (uVar1 = mbedtls_mpi_write_file("E = ",&local_790,0x10,(FILE *)__stream), uVar1 != 0)) {
        __stream_00 = (FILE *)0x0;
LAB_001075ba:
        printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)uVar1);
        iVar2 = 1;
        goto LAB_00107430;
      }
      printf(" ok\n  . Exporting the private key in rsa_priv.txt...");
      fflush(_stdout);
      __stream_00 = fopen("rsa_priv.txt","wb+");
      if (__stream_00 != (FILE *)0x0) {
        uVar1 = mbedtls_mpi_write_file("N = ",&local_778,0x10,(FILE *)__stream_00);
        if (((((uVar1 == 0) &&
              (uVar1 = mbedtls_mpi_write_file("E = ",&local_790,0x10,(FILE *)__stream_00),
              uVar1 == 0)) &&
             (uVar1 = mbedtls_mpi_write_file("D = ",&local_718,0x10,(FILE *)__stream_00), uVar1 == 0
             )) && ((uVar1 = mbedtls_mpi_write_file("P = ",&local_6e8,0x10,(FILE *)__stream_00),
                    uVar1 == 0 &&
                    (uVar1 = mbedtls_mpi_write_file("Q = ",&local_700,0x10,(FILE *)__stream_00),
                    uVar1 == 0)))) &&
           ((uVar1 = mbedtls_mpi_write_file("DP = ",&local_730,0x10,(FILE *)__stream_00), uVar1 == 0
            && ((uVar1 = mbedtls_mpi_write_file("DQ = ",&local_748,0x10,(FILE *)__stream_00),
                uVar1 == 0 &&
                (uVar1 = mbedtls_mpi_write_file("QP = ",&local_760,0x10,(FILE *)__stream_00),
                uVar1 == 0)))))) {
          puts(" ok\n");
          iVar2 = 0;
          goto LAB_00107430;
        }
        goto LAB_001075ba;
      }
      puts(" failed\n  ! could not open rsa_priv.txt for writing");
    }
    else {
      pcVar3 = " failed\n  ! could not export RSA parameters\n";
LAB_0010754a:
      puts(pcVar3);
      __stream = (FILE *)0x0;
    }
  }
  else {
    pcVar3 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
LAB_0010741d:
    __stream = (FILE *)0x0;
    printf(pcVar3,(ulong)uVar1);
  }
  iVar2 = 1;
  __stream_00 = (FILE *)0x0;
LAB_00107430:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  mbedtls_mpi_free(&local_778);
  mbedtls_mpi_free(&local_6e8);
  mbedtls_mpi_free(&local_700);
  mbedtls_mpi_free(&local_718);
  mbedtls_mpi_free(&local_790);
  mbedtls_mpi_free(&local_730);
  mbedtls_mpi_free(&local_748);
  mbedtls_mpi_free(&local_760);
  mbedtls_rsa_free(&local_6d0);
  mbedtls_ctr_drbg_free(&local_580);
  mbedtls_entropy_free(&local_428);
  return iVar2;
}

Assistant:

int main( void )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    FILE *fpub  = NULL;
    FILE *fpriv = NULL;
    const char *pers = "rsa_genkey";

    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the RSA key [ %d-bit ]...", KEY_SIZE );
    fflush( stdout );

    if( ( ret = mbedtls_rsa_gen_key( &rsa, mbedtls_ctr_drbg_random, &ctr_drbg, KEY_SIZE,
                                     EXPONENT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the public  key in rsa_pub.txt...." );
    fflush( stdout );

    if( ( ret = mbedtls_rsa_export    ( &rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
        ( ret = mbedtls_rsa_export_crt( &rsa, &DP, &DQ, &QP ) )      != 0 )
    {
        mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
        goto exit;
    }

    if( ( fpub = fopen( "rsa_pub.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_pub.txt for writing\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = ", &N, 16, fpub ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = ", &E, 16, fpub ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the private key in rsa_priv.txt..." );
    fflush( stdout );

    if( ( fpriv = fopen( "rsa_priv.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_priv.txt for writing\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = " , &N , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = " , &E , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "D = " , &D , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "P = " , &P , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "Q = " , &Q , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DP = ", &DP, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DQ = ", &DQ, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "QP = ", &QP, 16, fpriv ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }
    mbedtls_printf( " ok\n\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( fpub  != NULL )
        fclose( fpub );

    if( fpriv != NULL )
        fclose( fpriv );

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );
    mbedtls_rsa_free( &rsa );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}